

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O0

SPAKE2_CTX *
SPAKE2_CTX_new(spake2_role_t my_role,uint8_t *my_name,size_t my_name_len,uint8_t *their_name,
              size_t their_name_len)

{
  int iVar1;
  undefined1 local_60 [8];
  CBS their_name_cbs;
  CBS my_name_cbs;
  SPAKE2_CTX *ctx;
  size_t their_name_len_local;
  uint8_t *their_name_local;
  size_t my_name_len_local;
  uint8_t *my_name_local;
  SPAKE2_CTX *pSStack_10;
  spake2_role_t my_role_local;
  
  pSStack_10 = (SPAKE2_CTX *)OPENSSL_zalloc(0xd0);
  if (pSStack_10 == (SPAKE2_CTX *)0x0) {
    pSStack_10 = (SPAKE2_CTX *)0x0;
  }
  else {
    pSStack_10->my_role = my_role;
    CBS_init((CBS *)&their_name_cbs.len,my_name,my_name_len);
    CBS_init((CBS *)local_60,their_name,their_name_len);
    iVar1 = CBS_stow((CBS *)&their_name_cbs.len,&pSStack_10->my_name,&pSStack_10->my_name_len);
    if ((iVar1 == 0) ||
       (iVar1 = CBS_stow((CBS *)local_60,&pSStack_10->their_name,&pSStack_10->their_name_len),
       iVar1 == 0)) {
      SPAKE2_CTX_free(pSStack_10);
      pSStack_10 = (SPAKE2_CTX *)0x0;
    }
  }
  return pSStack_10;
}

Assistant:

SPAKE2_CTX *SPAKE2_CTX_new(enum spake2_role_t my_role, const uint8_t *my_name,
                           size_t my_name_len, const uint8_t *their_name,
                           size_t their_name_len) {
  SPAKE2_CTX *ctx =
      reinterpret_cast<SPAKE2_CTX *>(OPENSSL_zalloc(sizeof(SPAKE2_CTX)));
  if (ctx == NULL) {
    return NULL;
  }

  ctx->my_role = my_role;

  CBS my_name_cbs, their_name_cbs;
  CBS_init(&my_name_cbs, my_name, my_name_len);
  CBS_init(&their_name_cbs, their_name, their_name_len);
  if (!CBS_stow(&my_name_cbs, &ctx->my_name, &ctx->my_name_len) ||
      !CBS_stow(&their_name_cbs, &ctx->their_name, &ctx->their_name_len)) {
    SPAKE2_CTX_free(ctx);
    return NULL;
  }

  return ctx;
}